

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  bool bVar2;
  Nes nes;
  ifstream fs;
  
  if (argc == 2) {
    n_e_s::nes::Nes::Nes(&nes);
    std::ifstream::ifstream(&fs,argv[1],_S_bin);
    n_e_s::nes::Nes::load_rom(&nes,(istream *)&fs);
    iVar1 = 10000000;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      n_e_s::nes::Nes::execute(&nes);
    }
    std::ifstream::~ifstream(&fs);
    n_e_s::nes::Nes::~Nes(&nes);
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv) {
    if (argc != 2) {
        return 1;
    }

    Nes nes;
    std::ifstream fs(argv[1], std::ios::binary);
    nes.load_rom(fs);

    for (uint32_t i = 0; i < 10'000'000; ++i) {
        nes.execute();
    }

    return 0;
}